

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_value_t * ztast_value_from_integer(ztast_t *ast,int integer)

{
  ztast_value_data in_ESI;
  long in_RDI;
  ztast_value_t *val;
  ztast_value_t *local_8;
  
  local_8 = (ztast_value_t *)(**(code **)(in_RDI + 8))(8,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_value_t *)0x0) {
    local_8 = (ztast_value_t *)0x0;
  }
  else {
    local_8->type = ZTVAL_INTEGER;
    local_8->data = in_ESI;
  }
  return local_8;
}

Assistant:

ztast_value_t *ztast_value_from_integer(ztast_t *ast, int integer)
{
  ztast_value_t *val;

  assert(ast);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_value_from_integer\n");
#endif

  val = ZTAST_MALLOC(sizeof(*val));
  if (val == NULL)
    return NULL;

  val->type         = ZTVAL_INTEGER;
  val->data.integer = integer;

  return val;
}